

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O0

void __thiscall
agge::tests::mocks::mask<8ul>::
mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,3>
          (mask<8ul> *this,
          pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*cells) [3],
          int y0)

{
  int iVar1;
  int local_38;
  int j;
  int local_28;
  int local_24;
  int i;
  int max_x;
  int min_x;
  int y0_local;
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*cells_local) [3];
  mask<8UL> *this_local;
  
  *(int *)(this + 4) = y0;
  *(undefined4 *)(this + 8) = 3;
  std::
  vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
  ::vector((vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
            *)(this + 0x10));
  i = 0x7fffffff;
  local_24 = -0x7fffffff;
  for (local_28 = 0; local_28 != 3; local_28 = local_28 + 1) {
    std::
    vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
    ::push_back((vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                 *)(this + 0x10),*cells + local_28);
    for (local_38 = 0;
        (long)local_38 != ((long)(*cells)[local_28].second - (long)(*cells)[local_28].first) / 0xc;
        local_38 = local_38 + 1) {
      i = agge_min<int>(i,(*cells)[local_28].first[local_38].x);
      local_24 = agge_max<int>(i,(*cells)[local_28].first[local_38].x);
    }
  }
  iVar1 = agge_max<int>(local_24 - i,-1);
  *(int *)this = iVar1 + 1;
  return;
}

Assistant:

mask(const T (&cells)[n], int y0)
					: _min_y(y0), _height(n)
				{
					int min_x = 0x7FFFFFFF, max_x = -0x7FFFFFFF;

					for (int i = 0; i != n; ++i)
					{
						_cells.push_back(cells[i]);
						for (int j = 0; j != cells[i].second - cells[i].first; ++j)
						{
							min_x = agge_min(min_x, (cells[i].first + j)->x);
							max_x = agge_max(min_x, (cells[i].first + j)->x);
						}
					}
					_width = agge_max(max_x - min_x, -1) + 1;
				}